

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O2

int AF_AActor_A_KillSiblings
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  int selector;
  bool bVar1;
  AActor *pAVar2;
  AActor *pAVar3;
  AActor *pAVar4;
  int selector_00;
  char *pcVar5;
  AActor *origin;
  TThinkerIterator<AActor> it;
  int local_74;
  int local_70;
  int local_6c;
  FName local_68;
  FName local_64;
  PClassActor *local_60;
  AActor *local_58;
  AActor *local_50;
  FThinkerIterator local_48;
  
  if (numparam < 1) {
    pcVar5 = "(paramnum) < numparam";
    goto LAB_003eee39;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003eee0a:
    pcVar5 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003eee39:
    __assert_fail(pcVar5,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x17fa,
                  "int AF_AActor_A_KillSiblings(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  origin = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (origin == (AActor *)0x0) goto LAB_003eebe7;
    bVar1 = DObject::IsKindOf((DObject *)origin,AActor::RegistrationInfo.MyClass);
    if (!bVar1) {
      pcVar5 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003eee39;
    }
  }
  else {
    if (origin != (AActor *)0x0) goto LAB_003eee0a;
LAB_003eebe7:
    origin = (AActor *)0x0;
  }
  if (numparam == 1) {
    param = defaultparam->Array;
    if (param[1].field_0.field_3.Type != '\0') {
      pcVar5 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003eeec7:
      __assert_fail(pcVar5,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x17fb,
                    "int AF_AActor_A_KillSiblings(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    local_6c = param[1].field_0.i;
LAB_003eec49:
    if (param[2].field_0.field_3.Type != '\0') {
      pcVar5 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003eeee6:
      __assert_fail(pcVar5,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x17fc,
                    "int AF_AActor_A_KillSiblings(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    local_70 = param[2].field_0.i;
LAB_003eec5c:
    if (param[3].field_0.field_3.Type != '\x03') {
LAB_003eee13:
      pcVar5 = 
      "(defaultparam[paramnum]).Type == REGT_POINTER && ((defaultparam[paramnum]).atag == ATAG_OBJECT || (defaultparam[paramnum]).a == nullptr)"
      ;
LAB_003eee1a:
      __assert_fail(pcVar5,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x17fd,
                    "int AF_AActor_A_KillSiblings(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    local_60 = (PClassActor *)param[3].field_0.field_1.a;
    if (param[3].field_0.field_1.atag != 1) {
      if (local_60 != (PClassActor *)0x0) goto LAB_003eee13;
      local_60 = (PClassActor *)0x0;
    }
LAB_003eec7d:
    if (param[4].field_0.field_3.Type != '\0') {
      pcVar5 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003eee96:
      __assert_fail(pcVar5,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x17fe,
                    "int AF_AActor_A_KillSiblings(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    local_74 = param[4].field_0.i;
LAB_003eec90:
    if (param[5].field_0.field_3.Type != '\0') {
      pcVar5 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003eee77:
      __assert_fail(pcVar5,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x17ff,
                    "int AF_AActor_A_KillSiblings(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    selector_00 = param[5].field_0.i;
  }
  else {
    if (param[1].field_0.field_3.Type != '\0') {
      pcVar5 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003eeec7;
    }
    local_6c = param[1].field_0.i;
    if ((uint)numparam < 3) {
      param = defaultparam->Array;
      goto LAB_003eec49;
    }
    if (param[2].field_0.field_3.Type != '\0') {
      pcVar5 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003eeee6;
    }
    local_70 = param[2].field_0.i;
    if (numparam == 3) {
      param = defaultparam->Array;
      goto LAB_003eec5c;
    }
    if ((param[3].field_0.field_3.Type != '\x03') ||
       (local_60 = (PClassActor *)param[3].field_0.field_1.a,
       local_60 != (PClassActor *)0x0 && param[3].field_0.field_1.atag != 1)) {
      pcVar5 = 
      "(param[paramnum]).Type == REGT_POINTER && ((param[paramnum]).atag == ATAG_OBJECT || (param[paramnum]).a == nullptr)"
      ;
      goto LAB_003eee1a;
    }
    if ((uint)numparam < 5) {
      param = defaultparam->Array;
      goto LAB_003eec7d;
    }
    if (param[4].field_0.field_3.Type != '\0') {
      pcVar5 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003eee96;
    }
    local_74 = param[4].field_0.i;
    if (numparam == 5) {
      param = defaultparam->Array;
      goto LAB_003eec90;
    }
    if (param[5].field_0.field_3.Type != '\0') {
      pcVar5 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003eee77;
    }
    selector_00 = param[5].field_0.i;
    if (6 < (uint)numparam) {
      if (param[6].field_0.field_3.Type != '\0') {
        pcVar5 = "(param[paramnum]).Type == REGT_INT";
        goto LAB_003eee58;
      }
      goto LAB_003eecaf;
    }
    param = defaultparam->Array;
  }
  if (param[6].field_0.field_3.Type != '\0') {
    pcVar5 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003eee58:
    __assert_fail(pcVar5,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1800,
                  "int AF_AActor_A_KillSiblings(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
LAB_003eecaf:
  selector = param[6].field_0.i;
  local_50 = COPY_AAPTR(origin,selector_00);
  local_58 = COPY_AAPTR(origin,selector);
  TThinkerIterator<AActor>::TThinkerIterator((TThinkerIterator<AActor> *)&local_48,0x80);
  pAVar2 = GC::ReadBarrier<AActor>((AActor **)&origin->master);
  if (pAVar2 != (AActor *)0x0) {
    while( true ) {
      pAVar2 = (AActor *)FThinkerIterator::Next(&local_48,false);
      if (pAVar2 == (AActor *)0x0) break;
      pAVar3 = GC::ReadBarrier<AActor>((AActor **)&origin->master);
      pAVar4 = GC::ReadBarrier<AActor>((AActor **)&pAVar2->master);
      if ((pAVar2 != origin) && (pAVar4 == pAVar3)) {
        local_64.Index = local_6c;
        local_68.Index = local_74;
        DoKill(pAVar2,local_58,local_50,&local_64,local_70,local_60,&local_68);
      }
    }
  }
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_KillSiblings)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_NAME_DEF	(damagetype)	
	PARAM_INT_DEF	(flags)			
	PARAM_CLASS_DEF	(filter, AActor)
	PARAM_NAME_DEF	(species)		
	PARAM_INT_DEF	(src)			
	PARAM_INT_DEF	(inflict)		

	AActor *source = COPY_AAPTR(self, src);
	AActor *inflictor = COPY_AAPTR(self, inflict);

	TThinkerIterator<AActor> it;
	AActor *mo;

	if (self->master != NULL)
	{
		while ( (mo = it.Next()) )
		{
			if (mo->master == self->master && mo != self)
			{ 
				DoKill(mo, inflictor, source, damagetype, flags, filter, species);
			}
		}
	}
	return 0;
}